

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O1

bool __thiscall ExportDirWrapper::wrap(ExportDirWrapper *this)

{
  uint uVar1;
  Executable *pEVar2;
  int iVar3;
  offset_t oVar4;
  undefined4 extraout_var;
  ExportEntryWrapper *this_00;
  DWORD *pDVar6;
  size_t entryNumber;
  bool bVar7;
  ExportEntryWrapper *local_38;
  long lVar5;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  mapNames(this);
  oVar4 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar2 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  iVar3 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar2,oVar4,2,0x28,0)
  ;
  lVar5 = CONCAT44(extraout_var,iVar3);
  if ((lVar5 != 0) && (uVar1 = *(uint *)(lVar5 + 0x14), (ulong)uVar1 != 0)) {
    entryNumber = 0;
    do {
      this_00 = (ExportEntryWrapper *)operator_new(0x40);
      ExeNodeWrapper::ExeNodeWrapper
                ((ExeNodeWrapper *)this_00,
                 (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe,(ExeNodeWrapper *)this,entryNumber);
      (this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
      _vptr_AbstractByteBuffer = (_func_int **)&PTR__ExeNodeWrapper_00157890;
      this_00->parentDir = this;
      pDVar6 = ExportEntryWrapper::getFuncRvaPtr(this_00);
      if (pDVar6 == (DWORD *)0x0) {
        (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
          _vptr_AbstractByteBuffer[1])(this_00);
        break;
      }
      local_38 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(ExeNodeWrapper **)&local_38);
      bVar7 = (ulong)uVar1 - 1 != entryNumber;
      entryNumber = entryNumber + 1;
    } while (bVar7);
  }
  return lVar5 != 0;
}

Assistant:

bool ExportDirWrapper::wrap()
{
    clear();
    mapNames();

    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxFunc = exp->NumberOfFunctions;

    for (size_t i = 0; i < maxFunc; i++) {
        //TODO: build entries...
        ExportEntryWrapper *entry = new ExportEntryWrapper(m_Exe, this, i);
        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        this->entries.push_back(entry);
    }
    return true;
}